

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctf-2-json-val-req.cpp
# Opt level: O0

void __thiscall
yactfr::internal::JsonFlBitMapTypeValReq::JsonFlBitMapTypeValReq(JsonFlBitMapTypeValReq *this)

{
  initializer_list<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  __l;
  char *pcVar1;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  *local_128;
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  local_fc;
  key_equal local_fb;
  hasher local_fa;
  undefined1 local_f9;
  undefined1 local_f8 [104];
  undefined1 local_90 [95];
  allocator local_31;
  string local_30;
  JsonFlBitMapTypeValReq *local_10;
  JsonFlBitMapTypeValReq *this_local;
  
  (this->super_JsonFlBitArrayTypeValReq).super_JsonDtValReq.super_JsonObjValReq.super_JsonValReq.
  _vptr_JsonValReq = (_func_int **)&PTR__JsonFlBitMapTypeValReq_007df420;
  local_10 = this;
  pcVar1 = typeStr();
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_30,pcVar1,&local_31);
  local_f9 = 1;
  local_f8._40_8_ = local_f8 + 0x30;
  JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonUIntValReq>::shared
            ((JsonIntTypeMappingsFlagsValReq<yactfr::internal::JsonUIntValReq> *)local_f8,"flag",
             "fixed-length bit map type flags",false);
  JsonObjValPropReq::JsonObjValPropReq((JsonObjValPropReq *)(local_f8 + 0x10),(Sp *)local_f8,true);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
  ::pair<const_char_*const_&,_true>
            ((pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
              *)(local_f8 + 0x30),(char **)&strs::flags,(JsonObjValPropReq *)(local_f8 + 0x10));
  local_f9 = 0;
  local_90._0_8_ = local_f8 + 0x30;
  local_90._8_8_ = 1;
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::allocator(&local_fc);
  __l._M_len = local_90._8_8_;
  __l._M_array = (iterator)local_90._0_8_;
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
                   *)(local_90 + 0x10),__l,0,&local_fa,&local_fb,&local_fc);
  JsonFlBitArrayTypeValReq::JsonFlBitArrayTypeValReq
            (&this->super_JsonFlBitArrayTypeValReq,&local_30,(PropReqs *)(local_90 + 0x10));
  std::
  unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
  ::~unordered_map((unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>_>
                    *)(local_90 + 0x10));
  std::
  allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>_>
  ::~allocator(&local_fc);
  local_128 = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
               *)local_90;
  do {
    local_128 = local_128 + -1;
    std::
    pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
    ::~pair(local_128);
  } while (local_128 !=
           (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_yactfr::internal::JsonObjValPropReq>
            *)(local_f8 + 0x30));
  JsonObjValPropReq::~JsonObjValPropReq((JsonObjValPropReq *)(local_f8 + 0x10));
  std::shared_ptr<const_yactfr::internal::JsonValReq>::~shared_ptr
            ((shared_ptr<const_yactfr::internal::JsonValReq> *)local_f8);
  std::__cxx11::string::~string((string *)&local_30);
  std::allocator<char>::~allocator((allocator<char> *)&local_31);
  (this->super_JsonFlBitArrayTypeValReq).super_JsonDtValReq.super_JsonObjValReq.super_JsonValReq.
  _vptr_JsonValReq = (_func_int **)&PTR__JsonFlBitMapTypeValReq_007df420;
  return;
}

Assistant:

explicit JsonFlBitMapTypeValReq() :
        JsonFlBitArrayTypeValReq {this->typeStr(), {
            {strs::flags, {
                JsonIntTypeMappingsFlagsValReq<JsonUIntValReq>::shared("flag",
                                                                       "fixed-length bit map type flags",
                                                                       false),
                true,
            }},
        }}
    {
    }